

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.h
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::~InterfaceVariableScalarReplacement
          (InterfaceVariableScalarReplacement *this)

{
  InterfaceVariableScalarReplacement *this_local;
  
  ~InterfaceVariableScalarReplacement(this);
  ::operator_delete(this,0x118);
  return;
}

Assistant:

InterfaceVariableScalarReplacement() {}